

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syslog_sink.h
# Opt level: O0

void __thiscall spdlog::sinks::syslog_sink<std::mutex>::~syslog_sink(syslog_sink<std::mutex> *this)

{
  base_sink<std::mutex> *in_RDI;
  
  (in_RDI->super_sink)._vptr_sink = (_func_int **)&PTR__syslog_sink_009308f8;
  closelog();
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  base_sink<std::mutex>::~base_sink(in_RDI);
  return;
}

Assistant:

~syslog_sink() override { ::closelog(); }